

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_database.cpp
# Opt level: O0

string * read_shader_code_file(string *__return_storage_ptr__,string *p_path,ShaderType p_type)

{
  undefined8 uVar1;
  streambuf *psVar2;
  failure e;
  string local_3e0 [32];
  stringstream local_3c0 [8];
  stringstream fragment_shader_stream;
  undefined1 local_3b0 [392];
  long local_228;
  ifstream ifs;
  ShaderType p_type_local;
  string *p_path_local;
  string *content;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::ifstream::ifstream(&local_228);
  uVar1 = *(undefined8 *)(local_228 + -0x18);
  std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions((int)&local_228 + (int)uVar1);
  std::ifstream::open((string *)&local_228,(_Ios_Openmode)p_path);
  std::__cxx11::stringstream::stringstream(local_3c0);
  psVar2 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_3b0,psVar2);
  std::ifstream::close();
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_3e0);
  std::__cxx11::string::~string(local_3e0);
  std::__cxx11::stringstream::~stringstream(local_3c0);
  std::ifstream::~ifstream(&local_228);
  return __return_storage_ptr__;
}

Assistant:

std::string read_shader_code_file(
    const std::string &p_path,
    const ShaderType p_type)
{
    std::string content;
    std::ifstream ifs;
    ifs.exceptions(std::ifstream::failbit | std::ifstream::badbit);
    try
    {
        ifs.open(p_path);
        std::stringstream fragment_shader_stream;
        fragment_shader_stream << ifs.rdbuf();
        ifs.close();
        content = fragment_shader_stream.str();
    }
    catch (std::ifstream::failure e)
    {
        std::cerr << "shader file could not be loaded p_path:" << p_path << "\n";
    }
    return content;
}